

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

Regexp * __thiscall
re2::SimplifyWalker::ShortVisit(SimplifyWalker *this,Regexp *re,Regexp *parent_arg)

{
  Regexp *pRVar1;
  LogMessage LStack_188;
  
  LogMessage::LogMessage
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
             0x1b4,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&LStack_188.str_,"SimplifyWalker::ShortVisit called",0x21);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  pRVar1 = Regexp::Incref(re);
  return pRVar1;
}

Assistant:

Regexp* SimplifyWalker::ShortVisit(Regexp* re, Regexp* parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "SimplifyWalker::ShortVisit called";
  return re->Incref();
}